

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O1

int __thiscall graphics101::ShaderProgram::link(ShaderProgram *this,char *__from,char *__to)

{
  uint uVar1;
  int iVar2;
  pointer puVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined8 extraout_RAX;
  uint *shader;
  pointer puVar6;
  GLint info_log_length;
  GLint status;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attached_shaders;
  vector<char,_std::allocator<char>_> info_log;
  int local_70;
  int local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<char,_std::allocator<char>_> local_48;
  
  (*gl3wProcs.ptr[0x14e])((ulong)this->m_program);
  local_6c = 0;
  (*gl3wProcs.ptr[0xf2])((ulong)this->m_program,0x8b82,&local_6c);
  if (local_6c != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Shader linker error: ",0x15);
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_68,1);
    uVar1 = this->m_program;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_70 = 0;
    (*gl3wProcs.ptr[0xf2])((ulong)uVar1,0x8b84);
    std::vector<char,_std::allocator<char>_>::resize(&local_48,(long)local_70);
    (*gl3wProcs.ptr[0xe8])
              ((ulong)uVar1,
               (ulong)(uint)((int)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (int)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start),0);
    std::__cxx11::string::string
              ((string *)&local_68,
               local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,(allocator *)&local_70);
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_68.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_48,1);
    if ((pointer *)
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
  (*gl3wProcs.ptr[0xf2])((ulong)this->m_program,0x8b85);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_68,
             (long)(int)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  uVar5 = (*gl3wProcs.ptr[0xc0])
                    ((ulong)this->m_program,
                     (ulong)((long)local_68.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_68.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2,0);
  puVar3 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar6 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; iVar2 = local_6c, puVar6 != puVar3;
      puVar6 = puVar6 + 1) {
    uVar5 = (*gl3wProcs.ptr[0x7c])((ulong)this->m_program,(ulong)*puVar6);
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
    uVar5 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)uVar5 >> 8),iVar2 != 0);
}

Assistant:

bool ShaderProgram::link() {
    glLinkProgram( m_program );
    
    GLint status = 0;
    glGetProgramiv( m_program, GL_LINK_STATUS, &status );
    
    if( status != GL_TRUE ) {
        cerr << "Shader linker error: " << '\n' << getProgramInfoLog(m_program) << '\n';
    }
    
    // Now that we have linked, detach all shaders.
    std::vector< GLuint > attached_shaders;
    {
        GLint num_attached_shaders = 0;
        glGetProgramiv( m_program, GL_ATTACHED_SHADERS, &num_attached_shaders );
        attached_shaders.resize( num_attached_shaders );
    }
    glGetAttachedShaders( m_program, attached_shaders.size(), nullptr, attached_shaders.data() );
    
	// Free the shaders by detaching them. (They have already been marked for deletion.)
	for( const auto& shader : attached_shaders ) {
	    glDetachShader( m_program, shader );
	}

    return status;
}